

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O3

int tlp_mr_data_length(tlp_mr_hdr *mh)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  uVar2 = (mh->tlp).falen;
  iVar3 = ((ushort)(uVar2 << 8 | uVar2 >> 8) & 0x3ff) << 2;
  bVar1 = mh->field_0x7;
  if (((bVar1 & 0xf) != 0) && ((bVar1 & 0xf) != 0xf)) {
    uVar6 = 0;
    do {
      iVar3 = iVar3 + -1 + (uint)(((bVar1 & 0xf) >> (uVar6 & 0x1f) & 1) != 0);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 4);
  }
  iVar4 = iVar3;
  if (0x1f < (byte)(bVar1 + 0x10)) {
    iVar4 = iVar3 + -4;
    iVar5 = 0;
    do {
      if (((uint)(bVar1 >> 4) << ((byte)iVar5 & 0x1f) & 8) != 0) {
        return iVar3;
      }
      iVar3 = iVar3 + -1;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 4);
  }
  return iVar4;
}

Assistant:

int tlp_mr_data_length(struct tlp_mr_hdr *mh)
{
	int n;
	uint32_t len;

	len = tlp_length(mh->tlp.falen) << 2;

	if (mh->fstdw && mh->fstdw != 0xF) {
		for (n = 0; n < 4; n++) {
			if ((mh->fstdw & (0x1 << n)) == 0) {
				len--;
			}
		}
	}

	if (mh->lstdw && mh->lstdw != 0xF) {
		for (n = 0; n < 4; n++) {
			if ((mh->lstdw & (0x8 >> n)) == 0) {
				len--;
			} else
				break;
		}
	}

	return len;
}